

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

void cimg_library::CImgDisplay::_render_resize<unsigned_int,unsigned_int>
               (uint *ptrs,uint ws,uint hs,uint *ptrd,uint wd,uint hd)

{
  uint uVar1;
  void *pvVar2;
  uint *puVar3;
  uint uVar4;
  long lVar5;
  uint *puVar6;
  uint *puVar7;
  long lVar8;
  ulong uVar9;
  float fVar10;
  float fVar11;
  
  uVar9 = (ulong)wd;
  pvVar2 = operator_new__(uVar9 * 4);
  puVar3 = (uint *)operator_new__((ulong)(hd + 1) << 2);
  if (wd != 0) {
    lVar8 = 0;
    fVar10 = 0.0;
    do {
      fVar11 = (float)ws / (float)uVar9 + fVar10;
      *(int *)((long)pvVar2 + lVar8 * 4) = (int)(long)fVar11 - (int)(long)fVar10;
      lVar8 = lVar8 + 1;
      fVar10 = fVar11;
    } while (wd != (uint)lVar8);
  }
  puVar7 = puVar3;
  if (hd != 0) {
    fVar10 = 0.0;
    uVar4 = hd;
    do {
      fVar11 = (float)hs / (float)hd + fVar10;
      *puVar7 = ((int)(long)fVar11 - (int)(long)fVar10) * ws;
      puVar7 = puVar7 + 1;
      uVar4 = uVar4 - 1;
      fVar10 = fVar11;
    } while (uVar4 != 0);
  }
  *puVar7 = 0;
  if (hd != 0) {
    uVar4 = 0;
    puVar7 = puVar3;
    do {
      if (wd != 0) {
        lVar8 = 0;
        lVar5 = 0;
        puVar6 = ptrs;
        do {
          ptrd[lVar5] = *puVar6;
          puVar6 = puVar6 + *(uint *)((long)pvVar2 + lVar5 * 4);
          lVar5 = lVar5 + 1;
          lVar8 = lVar8 + -4;
        } while (wd != (uint)lVar5);
        ptrd = (uint *)((long)ptrd - lVar8);
      }
      uVar1 = *puVar7;
      while( true ) {
        uVar4 = uVar4 + 1;
        puVar7 = puVar7 + 1;
        if ((uVar1 != 0) || (hd <= uVar4)) break;
        memcpy(ptrd,ptrd + -uVar9,uVar9 * 4);
        uVar1 = *puVar7;
        ptrd = ptrd + uVar9;
      }
      ptrs = ptrs + uVar1;
    } while (uVar4 < hd);
  }
  operator_delete__(pvVar2);
  operator_delete__(puVar3);
  return;
}

Assistant:

static void _render_resize(const T *ptrs, const unsigned int ws, const unsigned int hs,
                               t *ptrd, const unsigned int wd, const unsigned int hd) {
      unsigned int *const offx = new unsigned int[wd], *const offy = new unsigned int[hd+1], *poffx, *poffy;
      float s, curr, old;
      s = (float)ws/wd;
      poffx = offx; curr = 0; for (unsigned int x = 0; x<wd; ++x) { old = curr; curr+=s; *(poffx++) = (unsigned int)curr - (unsigned int)old; }
      s = (float)hs/hd;
      poffy = offy; curr = 0; for (unsigned int y = 0; y<hd; ++y) { old = curr; curr+=s; *(poffy++) = ws*((unsigned int)curr - (unsigned int)old); }
      *poffy = 0;
      poffy = offy;
      for (unsigned int y = 0; y<hd; ) {
        const T *ptr = ptrs;
        poffx = offx;
        for (unsigned int x = 0; x<wd; ++x) { *(ptrd++) = *ptr; ptr+=*(poffx++); }
        ++y;
        unsigned int dy = *(poffy++);
        for ( ; !dy && y<hd; std::memcpy(ptrd,ptrd - wd,sizeof(t)*wd), ++y, ptrd+=wd, dy = *(poffy++)) {}
        ptrs+=dy;
      }
      delete[] offx; delete[] offy;
    }